

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

int re2::Fanout(Prog *prog,
               map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *histogram
               )

{
  byte bVar1;
  int iVar2;
  iterator this;
  iterator __k;
  int *piVar3;
  mapped_type *pmVar4;
  pointer ppVar5;
  Prog *in_RDI;
  int bucket;
  iterator i;
  SparseArray<int> fanout;
  SparseArray<int> *in_stack_000001e8;
  Prog *in_stack_000001f0;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  IndexValue *local_50;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  Prog::size(in_RDI);
  SparseArray<int>::SparseArray
            ((SparseArray<int> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),iVar2
            );
  Prog::Fanout(in_stack_000001f0,in_stack_000001e8);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::clear
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x224089)
  ;
  this = SparseArray<int>::begin((SparseArray<int> *)0x224096);
  local_50 = this;
  while( true ) {
    __k = SparseArray<int>::end
                    ((SparseArray<int> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (local_50 == __k) break;
    bVar1 = 0;
    while( true ) {
      iVar2 = 1 << (bVar1 & 0x1f);
      piVar3 = SparseArray<int>::IndexValue::value(local_50);
      if (*piVar3 <= iVar2) break;
      bVar1 = bVar1 + 1;
    }
    pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)this,&__k->index_);
    *pmVar4 = *pmVar4 + 1;
    local_50 = local_50 + 1;
  }
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::rbegin
            (in_stack_ffffffffffffff48);
  ppVar5 = std::reverse_iterator<std::_Rb_tree_iterator<std::pair<const_int,_int>_>_>::operator->
                     ((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_int,_int>_>_> *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  iVar2 = ppVar5->first;
  SparseArray<int>::~SparseArray((SparseArray<int> *)CONCAT44(iVar2,in_stack_ffffffffffffff50));
  return iVar2;
}

Assistant:

static int Fanout(Prog* prog, std::map<int, int>* histogram) {
  SparseArray<int> fanout(prog->size());
  prog->Fanout(&fanout);
  histogram->clear();
  for (SparseArray<int>::iterator i = fanout.begin(); i != fanout.end(); ++i) {
    // TODO(junyer): Optimise this?
    int bucket = 0;
    while (1 << bucket < i->value()) {
      bucket++;
    }
    (*histogram)[bucket]++;
  }
  return histogram->rbegin()->first;
}